

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::HasSOName(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  TargetType TVar3;
  LinkClosure *pLVar4;
  char *pcVar5;
  string local_60;
  string local_40;
  
  TVar3 = cmTarget::GetType(this->Target);
  if (TVar3 == SHARED_LIBRARY) {
    local_40.field_2._M_allocated_capacity = 0x4d414e4f535f4f4e;
    local_40.field_2._8_2_ = 0x45;
    local_40._M_string_length = 9;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    bVar2 = cmTarget::GetPropertyAsBool(this->Target,&local_40);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      this_00 = this->Makefile;
      pLVar4 = GetLinkClosure(this,config);
      pcVar1 = (pLVar4->LinkerLanguage)._M_dataplus._M_p;
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar1,pcVar1 + (pLVar4->LinkerLanguage)._M_string_length);
      pcVar5 = cmMakefile::GetSONameFlag(this_00,&local_60);
      bVar2 = pcVar5 != (char *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::HasSOName(const std::string& config) const
{
  // soname is supported only for shared libraries and modules,
  // and then only when the platform supports an soname flag.
  return ((this->GetType() == cmStateEnums::SHARED_LIBRARY) &&
          !this->GetPropertyAsBool("NO_SONAME") &&
          this->Makefile->GetSONameFlag(this->GetLinkerLanguage(config)));
}